

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HEkkDualRow.h
# Opt level: O2

void __thiscall HEkkDualRow::HEkkDualRow(HEkkDualRow *this,HEkk *simplex)

{
  _Rb_tree_header *p_Var1;
  
  this->ekk_instance_ = simplex;
  this->workSize = -1;
  (this->freeList)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->freeList)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  p_Var1 = &(this->freeList)._M_t._M_impl.super__Rb_tree_header;
  this->workNumTotPermutation = (HighsInt *)0x0;
  this->workMove = (int8_t *)0x0;
  this->workDual = (double *)0x0;
  this->workRange = (double *)0x0;
  this->work_devex_index = (HighsInt *)0x0;
  (this->freeList)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->freeList)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->freeList)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  this->packCount = 0;
  memset(&this->packIndex,0,0x8c);
  (this->original_workData).
  super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->original_workData).
  super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->original_workData).
  super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->sorted_workData).
  super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->sorted_workData).
  super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->sorted_workData).
  super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->alt_workGroup).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->alt_workGroup).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->alt_workGroup).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->analysis = (HighsSimplexAnalysis *)0x0;
  return;
}

Assistant:

HEkkDualRow(HEkk& simplex) : ekk_instance_(simplex) {}